

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_lang(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  char cVar1;
  lyxp_set_attrs *plVar2;
  lys_ext_instance_complex *plVar3;
  lyxp_set_nodes *plVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  lyd_node *root;
  lyd_attr *plVar8;
  __int32_t **pp_Var9;
  long lVar10;
  long lVar11;
  lys_ext_instance_complex **pplVar12;
  
  iVar6 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
  if (iVar6 != 0) {
    return -1;
  }
  if (set->type == LYXP_SET_NODE_SET) {
    plVar2 = (set->val).attrs;
    if (plVar2->type - LYXP_NODE_ELEM < 2) {
      plVar8 = plVar2->attr;
    }
    else {
      if (plVar2->type != LYXP_NODE_ATTR) goto LAB_001683f2;
      root = moveto_get_root(cur_node,options,(lyxp_node_type *)0x0);
      plVar8 = (lyd_attr *)lyd_attr_parent(root,plVar2->attr);
    }
    for (; plVar8 != (lyd_attr *)0x0; plVar8 = (lyd_attr *)(plVar8->value).instance) {
      pplVar12 = &plVar8->annotation;
      while (plVar3 = *pplVar12, plVar3 != (lys_ext_instance_complex *)0x0) {
        if (((*(char **)&plVar3->flags != (char *)0x0) &&
            (iVar6 = strcmp(*(char **)&plVar3->flags,"lang"), iVar6 == 0)) &&
           (iVar6 = strcmp(((lys_ext_instance_complex *)plVar3->arg_value)->module->name,"xml"),
           iVar6 == 0)) {
          plVar4 = ((*args)->val).nodes;
          lVar5 = 0;
          goto LAB_001684ba;
        }
        pplVar12 = (lys_ext_instance_complex **)&plVar3->parent;
      }
    }
  }
  else if (set->type != LYXP_SET_EMPTY) {
    pcVar7 = print_set_type(set);
    ly_vlog(LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,pcVar7,"lang(string)");
    return -1;
  }
  goto LAB_001683f2;
  while( true ) {
    pp_Var9 = __ctype_tolower_loc();
    lVar5 = lVar10 + 1;
    if ((*pp_Var9)[lVar11] != (*pp_Var9)[*(char *)((long)plVar3->ext + lVar10)]) break;
LAB_001684ba:
    lVar10 = lVar5;
    lVar11 = (long)*(char *)((long)&plVar4->node + lVar10);
    if (lVar11 == 0) goto LAB_00168501;
  }
  set_fill_boolean(set,0);
  if (*(char *)((long)&(((*args)->val).nodes)->node + lVar10) != '\0') {
    return 0;
  }
LAB_00168501:
  cVar1 = *(char *)((long)plVar3->ext + lVar10);
  if ((cVar1 == '-') || (cVar1 == '\0')) {
    set_fill_boolean(set,1);
    return 0;
  }
LAB_001683f2:
  set_fill_boolean(set,0);
  return 0;
}

Assistant:

static int
xpath_lang(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
           struct lyxp_set *set, int options)
{
    const struct lyd_node *node, *root;
    struct lyd_attr *attr = NULL;
    int i;

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    if (set->type == LYXP_SET_EMPTY) {
        set_fill_boolean(set, 0);
        return EXIT_SUCCESS;
    }
    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INCTX, LY_VLOG_NONE, NULL, print_set_type(set), "lang(string)");
        return -1;
    }

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        node = set->val.nodes[0].node;
        break;
    case LYXP_NODE_ATTR:
        root = moveto_get_root(cur_node, options, NULL);
        node = lyd_attr_parent(root, set->val.attrs[0].attr);
        break;
    default:
        /* nothing to do with roots */
        set_fill_boolean(set, 0);
        return EXIT_SUCCESS;
    }

    /* find lang attribute */
    for (; node; node = node->parent) {
        for (attr = node->attr; attr; attr = attr->next) {
            if (attr->name && !strcmp(attr->name, "lang") && !strcmp(attr->annotation->module->name, "xml")) {
                break;
            }
        }

        if (attr) {
            break;
        }
    }

    /* compare languages */
    if (!attr) {
        set_fill_boolean(set, 0);
    } else {
        for (i = 0; args[0]->val.str[i]; ++i) {
            if (tolower(args[0]->val.str[i]) != tolower(attr->value_str[i])) {
                set_fill_boolean(set, 0);
                break;
            }
        }
        if (!args[0]->val.str[i]) {
            if (!attr->value_str[i] || (attr->value_str[i] == '-')) {
                set_fill_boolean(set, 1);
            } else {
                set_fill_boolean(set, 0);
            }
        }
    }

    return EXIT_SUCCESS;
}